

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode_machine.cpp
# Opt level: O2

void __thiscall
randomx::BytecodeMachine::compileInstruction
          (BytecodeMachine *this,Instruction *instr,int i,InstructionByteCode *ibc)

{
  byte bVar1;
  byte bVar2;
  uint j;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  int_reg_t *piVar6;
  anon_union_8_2_131e9d4c_for_InstructionByteCode_4 aVar7;
  long lVar8;
  uint32_t uVar9;
  anon_union_8_2_131e9d4c_for_InstructionByteCode_4 *paVar10;
  NativeRegisterFile *pNVar11;
  anon_union_8_2_131e9d4c_for_InstructionByteCode_4 aVar12;
  uint uVar13;
  
  bVar1 = instr->opcode;
  if (bVar1 < 0x19) {
    uVar3 = instr->dst & 7;
    bVar1 = instr->src;
    ibc->type = IADD_RS;
    (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar3 * 8));
    (ibc->field_1).isrc = (int_reg_t *)((long)this->nreg->r + (ulong)((bVar1 & 7) << 3));
    (ibc->field_4).shift = instr->mod >> 2 & 3;
    uVar4 = 0;
    if (uVar3 == 5) {
      uVar4 = (long)(int)instr->imm32;
    }
    (ibc->field_2).imm = uVar4;
    uVar5 = (ulong)uVar3;
    goto LAB_00113633;
  }
  if (bVar1 < 0x20) {
    uVar5 = (ulong)(instr->dst & 7);
    uVar3 = instr->src & 7;
    ibc->type = IADD_M;
  }
  else {
    if (bVar1 < 0x30) {
      uVar5 = (ulong)(instr->dst & 7);
      uVar3 = instr->src & 7;
      ibc->type = ISUB_R;
LAB_00113560:
      (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uint)((int)uVar5 * 8));
      if ((char)uVar3 == (char)uVar5) {
        aVar12 = (anon_union_8_2_131e9d4c_for_InstructionByteCode_4)(long)(int)instr->imm32;
LAB_0011357a:
        paVar10 = &ibc->field_2;
        ibc->field_2 = aVar12;
      }
      else {
LAB_00113628:
        paVar10 = (anon_union_8_2_131e9d4c_for_InstructionByteCode_4 *)
                  ((long)this->nreg->r + (ulong)(uVar3 << 3));
      }
      (ibc->field_1).isrc = (int_reg_t *)paVar10;
      goto LAB_00113633;
    }
    if (0x36 < bVar1) {
      if (bVar1 < 0x47) {
        uVar5 = (ulong)(instr->dst & 7);
        uVar3 = instr->src & 7;
        ibc->type = IMUL_R;
        goto LAB_00113560;
      }
      if (bVar1 < 0x4b) {
        uVar5 = (ulong)(instr->dst & 7);
        uVar3 = instr->src & 7;
        ibc->type = IMUL_M;
        goto LAB_0011351c;
      }
      if (bVar1 < 0x4f) {
        bVar1 = instr->dst;
        bVar2 = instr->src;
        ibc->type = IMULH_R;
LAB_0011361a:
        uVar3 = bVar2 & 7;
        uVar5 = (ulong)(bVar1 & 7);
        (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)((bVar1 & 7) * 8));
        goto LAB_00113628;
      }
      if (bVar1 == 0x4f) {
        uVar5 = (ulong)(instr->dst & 7);
        uVar3 = instr->src & 7;
        ibc->type = IMULH_M;
        goto LAB_0011351c;
      }
      if (bVar1 < 0x54) {
        bVar1 = instr->dst;
        bVar2 = instr->src;
        ibc->type = ISMULH_R;
        goto LAB_0011361a;
      }
      if (bVar1 == 0x54) {
        uVar5 = (ulong)(instr->dst & 7);
        uVar3 = instr->src & 7;
        ibc->type = ISMULH_M;
        goto LAB_0011351c;
      }
      if (bVar1 < 0x5d) {
        uVar3 = instr->imm32;
        if ((uVar3 & uVar3 - 1) != 0) {
          uVar13 = instr->dst & 7;
          ibc->type = IMUL_R;
          (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar13 * 8));
          uVar4 = randomx_reciprocal(uVar3);
          (ibc->field_2).imm = uVar4;
          (ibc->field_1).isrc = (int_reg_t *)&ibc->field_2;
          this->registerUsage[uVar13] = i;
          return;
        }
LAB_001136a4:
        ibc->type = NOP;
        return;
      }
      if (bVar1 < 0x5f) {
        uVar3 = instr->dst & 7;
        uVar5 = (ulong)uVar3;
        ibc->type = INEG_R;
        (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar3 * 8));
        goto LAB_00113633;
      }
      if (bVar1 < 0x6e) {
        uVar5 = (ulong)(instr->dst & 7);
        uVar3 = instr->src & 7;
        ibc->type = IXOR_R;
        goto LAB_00113560;
      }
      if (bVar1 < 0x73) {
        uVar5 = (ulong)(instr->dst & 7);
        uVar3 = instr->src & 7;
        ibc->type = IXOR_M;
        goto LAB_0011351c;
      }
      if (bVar1 < 0x7b) {
        bVar1 = instr->dst;
        bVar2 = instr->src;
        ibc->type = IROR_R;
      }
      else {
        if (0x7c < bVar1) {
          if (bVar1 < 0x81) {
            uVar3 = instr->dst & 7;
            uVar13 = instr->src & 7;
            if ((char)uVar13 != (char)uVar3) {
              (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar3 * 8));
              (ibc->field_1).isrc = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar13 * 8));
              ibc->type = ISWAP_R;
              this->registerUsage[uVar3] = i;
              this->registerUsage[uVar13] = i;
              return;
            }
            goto LAB_001136a4;
          }
          if (bVar1 < 0x85) {
            uVar3 = instr->dst & 7;
            ibc->type = FSWAP_R;
            if ((byte)uVar3 < 4) {
              piVar6 = (int_reg_t *)((long)this->nreg->f[0] + (ulong)(uVar3 << 4));
              goto LAB_0011385a;
            }
            pNVar11 = this->nreg;
            uVar5 = (ulong)(uVar3 - 4) << 4;
LAB_00113851:
            piVar6 = (int_reg_t *)((long)pNVar11->e[0] + uVar5);
LAB_0011385a:
            (ibc->field_0).idst = piVar6;
            return;
          }
          if (bVar1 < 0x95) {
            bVar1 = instr->dst;
            bVar2 = instr->src;
            ibc->type = FADD_R;
LAB_00113819:
            piVar6 = (int_reg_t *)((long)this->nreg->f[0] + (ulong)((bVar1 & 3) << 4));
LAB_00113827:
            (ibc->field_0).idst = piVar6;
            (ibc->field_1).isrc = (int_reg_t *)((long)this->nreg->a[0] + (ulong)((bVar2 & 3) << 4));
            return;
          }
          if (bVar1 < 0x9a) {
            bVar1 = instr->dst;
            bVar2 = instr->src;
            ibc->type = FADD_M;
LAB_0011387a:
            piVar6 = (int_reg_t *)((long)this->nreg->f[0] + (ulong)((bVar1 & 3) << 4));
          }
          else {
            if (bVar1 < 0xaa) {
              bVar1 = instr->dst;
              bVar2 = instr->src;
              ibc->type = FSUB_R;
              goto LAB_00113819;
            }
            if (bVar1 < 0xaf) {
              bVar1 = instr->dst;
              bVar2 = instr->src;
              ibc->type = FSUB_M;
              goto LAB_0011387a;
            }
            if (bVar1 < 0xb5) {
              (ibc->field_0).idst =
                   (int_reg_t *)((long)this->nreg->f[0] + (ulong)((instr->dst & 3) << 4));
              ibc->type = FSCAL_R;
              return;
            }
            if (bVar1 < 0xd5) {
              bVar1 = instr->dst;
              bVar2 = instr->src;
              ibc->type = FMUL_R;
              piVar6 = (int_reg_t *)((long)this->nreg->e[0] + (ulong)((bVar1 & 3) << 4));
              goto LAB_00113827;
            }
            if (0xd8 < bVar1) {
              if (0xde < bVar1) {
                if (bVar1 < 0xef) {
                  ibc->type = CBRANCH;
                  uVar3 = instr->dst & 7;
                  (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar3 * 8));
                  ibc->field_4 = *(anon_union_2_2_d7ee7b4e_for_InstructionByteCode_7 *)
                                  (this->registerUsage + uVar3);
                  bVar1 = instr->mod >> 4;
                  (ibc->field_2).imm =
                       ((long)(int)instr->imm32 | 1L << bVar1 + 8) & ~(1L << bVar1 + 7);
                  ibc->memMask = 0xff00 << bVar1;
                  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
                    this->registerUsage[lVar8] = i;
                  }
                  return;
                }
                if (bVar1 != 0xef) {
                  bVar1 = instr->dst;
                  bVar2 = instr->src;
                  ibc->type = ISTORE;
                  (ibc->field_0).idst =
                       (int_reg_t *)((long)this->nreg->r + (ulong)((bVar1 & 7) << 3));
                  (ibc->field_1).isrc =
                       (int_reg_t *)((long)this->nreg->r + (ulong)((bVar2 & 7) << 3));
                  ibc->field_2 = (anon_union_8_2_131e9d4c_for_InstructionByteCode_4)
                                 (long)(int)instr->imm32;
                  if (instr->mod < 0xe0) {
                    uVar9 = 0x3ff8;
                    if ((instr->mod & 3) == 0) {
                      uVar9 = 0x3fff8;
                    }
                    ibc->memMask = uVar9;
                    return;
                  }
                  ibc->memMask = 0x1ffff8;
                  return;
                }
                (ibc->field_1).isrc =
                     (int_reg_t *)((long)this->nreg->r + (ulong)((instr->src & 7) << 3));
                ibc->type = CFROUND;
                aVar7._0_4_ = instr->imm32 & 0x3f;
                aVar7.imm._4_4_ = 0;
                goto LAB_001138ae;
              }
              bVar1 = instr->dst;
              ibc->type = FSQRT_R;
              pNVar11 = this->nreg;
              uVar5 = (ulong)((bVar1 & 3) << 4);
              goto LAB_00113851;
            }
            bVar1 = instr->dst;
            bVar2 = instr->src;
            ibc->type = FDIV_M;
            piVar6 = (int_reg_t *)((long)this->nreg->e[0] + (ulong)((bVar1 & 3) << 4));
          }
          (ibc->field_0).idst = piVar6;
          (ibc->field_1).isrc = (int_reg_t *)((long)this->nreg->r + (ulong)((bVar2 & 7) << 3));
          uVar9 = 0x3ff8;
          if ((instr->mod & 3) == 0) {
            uVar9 = 0x3fff8;
          }
          ibc->memMask = uVar9;
          aVar7 = (anon_union_8_2_131e9d4c_for_InstructionByteCode_4)(long)(int)instr->imm32;
LAB_001138ae:
          ibc->field_2 = aVar7;
          return;
        }
        bVar1 = instr->dst;
        bVar2 = instr->src;
        ibc->type = IROL_R;
      }
      uVar13 = bVar1 & 7;
      uVar3 = bVar2 & 7;
      uVar5 = (ulong)uVar13;
      (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar13 * 8));
      if ((char)uVar3 != (char)uVar13) goto LAB_00113628;
      aVar12.imm._4_4_ = 0;
      aVar12.imm._0_4_ = instr->imm32;
      goto LAB_0011357a;
    }
    uVar5 = (ulong)(instr->dst & 7);
    uVar3 = instr->src & 7;
    ibc->type = ISUB_M;
  }
LAB_0011351c:
  (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uint)((int)uVar5 * 8));
  ibc->field_2 = (anon_union_8_2_131e9d4c_for_InstructionByteCode_4)(long)(int)instr->imm32;
  if ((char)uVar3 == (char)uVar5) {
    (ibc->field_1).isrc = &zero;
    uVar9 = 0x1ffff8;
  }
  else {
    (ibc->field_1).isrc = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar3 << 3));
    uVar9 = 0x3ff8;
    if ((instr->mod & 3) == 0) {
      uVar9 = 0x3fff8;
    }
  }
  ibc->memMask = uVar9;
LAB_00113633:
  this->registerUsage[uVar5] = i;
  return;
}

Assistant:

void BytecodeMachine::compileInstruction(RANDOMX_GEN_ARGS) {
		int opcode = instr.opcode;

		if (opcode < ceil_IADD_RS) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IADD_RS;
			ibc.idst = &nreg->r[dst];
			if (dst != RegisterNeedsDisplacement) {
				ibc.isrc = &nreg->r[src];
				ibc.shift = instr.getModShift();
				ibc.imm = 0;
			}
			else {
				ibc.isrc = &nreg->r[src];
				ibc.shift = instr.getModShift();
				ibc.imm = signExtend2sCompl(instr.getImm32());
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IADD_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IADD_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISUB_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISUB_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = signExtend2sCompl(instr.getImm32());
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISUB_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISUB_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMUL_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IMUL_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = signExtend2sCompl(instr.getImm32());
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMUL_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IMUL_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMULH_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IMULH_R;
			ibc.idst = &nreg->r[dst];
			ibc.isrc = &nreg->r[src];
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMULH_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IMULH_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISMULH_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISMULH_R;
			ibc.idst = &nreg->r[dst];
			ibc.isrc = &nreg->r[src];
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISMULH_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISMULH_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMUL_RCP) {
			const uint32_t divisor = instr.getImm32();
			if (!isZeroOrPowerOf2(divisor)) {
				auto dst = instr.dst % RegistersCount;
				ibc.type = InstructionType::IMUL_R;
				ibc.idst = &nreg->r[dst];
				ibc.imm = randomx_reciprocal(divisor);
				ibc.isrc = &ibc.imm;
				registerUsage[dst] = i;
			}
			else {
				ibc.type = InstructionType::NOP;
			}
			return;
		}

		if (opcode < ceil_INEG_R) {
			auto dst = instr.dst % RegistersCount;
			ibc.type = InstructionType::INEG_R;
			ibc.idst = &nreg->r[dst];
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IXOR_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IXOR_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = signExtend2sCompl(instr.getImm32());
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IXOR_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IXOR_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IROR_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IROR_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = instr.getImm32();
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IROL_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IROL_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = instr.getImm32();
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISWAP_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			if (src != dst) {
				ibc.idst = &nreg->r[dst];
				ibc.isrc = &nreg->r[src];
				ibc.type = InstructionType::ISWAP_R;
				registerUsage[dst] = i;
				registerUsage[src] = i;
			}
			else {
				ibc.type = InstructionType::NOP;
			}
			return;
		}

		if (opcode < ceil_FSWAP_R) {
			auto dst = instr.dst % RegistersCount;
			ibc.type = InstructionType::FSWAP_R;
			if (dst < RegisterCountFlt)
				ibc.fdst = &nreg->f[dst];
			else
				ibc.fdst = &nreg->e[dst - RegisterCountFlt];
			return;
		}

		if (opcode < ceil_FADD_R) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegisterCountFlt;
			ibc.type = InstructionType::FADD_R;
			ibc.fdst = &nreg->f[dst];
			ibc.fsrc = &nreg->a[src];
			return;
		}

		if (opcode < ceil_FADD_M) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::FADD_M;
			ibc.fdst = &nreg->f[dst];
			ibc.isrc = &nreg->r[src];
			ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			ibc.imm = signExtend2sCompl(instr.getImm32());
			return;
		}

		if (opcode < ceil_FSUB_R) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegisterCountFlt;
			ibc.type = InstructionType::FSUB_R;
			ibc.fdst = &nreg->f[dst];
			ibc.fsrc = &nreg->a[src];
			return;
		}

		if (opcode < ceil_FSUB_M) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::FSUB_M;
			ibc.fdst = &nreg->f[dst];
			ibc.isrc = &nreg->r[src];
			ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			ibc.imm = signExtend2sCompl(instr.getImm32());
			return;
		}

		if (opcode < ceil_FSCAL_R) {
			auto dst = instr.dst % RegisterCountFlt;
			ibc.fdst = &nreg->f[dst];
			ibc.type = InstructionType::FSCAL_R;
			return;
		}

		if (opcode < ceil_FMUL_R) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegisterCountFlt;
			ibc.type = InstructionType::FMUL_R;
			ibc.fdst = &nreg->e[dst];
			ibc.fsrc = &nreg->a[src];
			return;
		}

		if (opcode < ceil_FDIV_M) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::FDIV_M;
			ibc.fdst = &nreg->e[dst];
			ibc.isrc = &nreg->r[src];
			ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			ibc.imm = signExtend2sCompl(instr.getImm32());
			return;
		}

		if (opcode < ceil_FSQRT_R) {
			auto dst = instr.dst % RegisterCountFlt;
			ibc.type = InstructionType::FSQRT_R;
			ibc.fdst = &nreg->e[dst];
			return;
		}

		if (opcode < ceil_CBRANCH) {
			ibc.type = InstructionType::CBRANCH;
			//jump condition
			int creg = instr.dst % RegistersCount;
			ibc.idst = &nreg->r[creg];
			ibc.target = registerUsage[creg];
			int shift = instr.getModCond() + ConditionOffset;
			ibc.imm = signExtend2sCompl(instr.getImm32()) | (1ULL << shift);
			if (ConditionOffset > 0 || shift > 0) //clear the bit below the condition mask - this limits the number of successive jumps to 2
				ibc.imm &= ~(1ULL << (shift - 1));
			ibc.memMask = ConditionMask << shift;
			//mark all registers as used
			for (unsigned j = 0; j < RegistersCount; ++j) {
				registerUsage[j] = i;
			}
			return;
		}

		if (opcode < ceil_CFROUND) {
			auto src = instr.src % RegistersCount;
			ibc.isrc = &nreg->r[src];
			ibc.type = InstructionType::CFROUND;
			ibc.imm = instr.getImm32() & 63;
			return;
		}

		if (opcode < ceil_ISTORE) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISTORE;
			ibc.idst = &nreg->r[dst];
			ibc.isrc = &nreg->r[src];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (instr.getModCond() < StoreL3Condition)
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			else
				ibc.memMask = ScratchpadL3Mask;
			return;
		}

		if (opcode < ceil_NOP) {
			ibc.type = InstructionType::NOP;
			return;
		}

		UNREACHABLE;
	}